

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O2

string * __thiscall
duckdb::AddConstraintInfo::ToString_abi_cxx11_
          (string *__return_storage_ptr__,AddConstraintInfo *this)

{
  pointer pCVar1;
  string local_30;
  
  ::std::__cxx11::string::string
            ((string *)__return_storage_ptr__,"ALTER TABLE ",(allocator *)&local_30);
  ParseInfo::QualifierToString
            (&local_30,&(this->super_AlterTableInfo).super_AlterInfo.catalog,
             &(this->super_AlterTableInfo).super_AlterInfo.schema,
             &(this->super_AlterTableInfo).super_AlterInfo.name);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  pCVar1 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::operator->
                     (&this->constraint);
  (*pCVar1->_vptr_Constraint[2])(&local_30,pCVar1);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string AddConstraintInfo::ToString() const {
	string result = "ALTER TABLE ";
	result += QualifierToString(catalog, schema, name);
	result += " ADD ";
	result += constraint->ToString();
	result += ";";
	return result;
}